

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void when_cb(Fl_Choice *i,void *v)

{
  byte bVar1;
  Fl_Menu_Item *pFVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  void *pvVar6;
  void **ppvVar7;
  Fl_Widget_Type *q;
  Fl_Type *pFVar8;
  ulong uVar9;
  
  if ((char *)v == "LOAD") {
    iVar4 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1e])();
    if (iVar4 != 0) {
      Fl_Widget::deactivate((Fl_Widget *)i);
      return;
    }
    Fl_Widget::activate((Fl_Widget *)i);
    bVar1 = current_widget->o->when_;
    pvVar6 = (void *)0x3e8;
    if ((bVar1 & 0xfd) != 0) {
      pvVar6 = (void *)(ulong)(bVar1 & 0xfffffffd);
    }
    ppvVar7 = &whenmenu[0].user_data_;
    lVar5 = 0;
    do {
      if (pvVar6 == *ppvVar7) {
        Fl_Choice::value(i,(int)lVar5);
        return;
      }
      lVar5 = lVar5 + 1;
      ppvVar7 = ppvVar7 + 7;
    } while (lVar5 != 5);
  }
  else {
    pFVar2 = (i->super_Fl_Menu_).value_;
    if (pFVar2 == (Fl_Menu_Item *)0x0) {
      lVar5 = -1;
    }
    else {
      lVar5 = (long)((int)((ulong)((long)pFVar2 - (long)(i->super_Fl_Menu_).menu_) >> 3) *
                    -0x49249249);
    }
    iVar4 = (int)whenmenu[lVar5].user_data_;
    if ((iVar4 != 0) && (Fl_Type::first != (Fl_Type *)0x0)) {
      uVar9 = (ulong)whenmenu[lVar5].user_data_ & 0xffffffff;
      pFVar8 = Fl_Type::first;
      bVar3 = false;
      if (iVar4 == 1000) {
        uVar9 = 0;
        bVar3 = false;
      }
      do {
        if (pFVar8->selected != '\0') {
          iVar4 = (*pFVar8->_vptr_Fl_Type[0x17])(pFVar8);
          if (iVar4 != 0) {
            *(byte *)((long)&(pFVar8[1].prev)->header_position + 3) =
                 *(byte *)((long)&(pFVar8[1].prev)->header_position + 3) & 2 | (byte)uVar9;
            bVar3 = true;
          }
        }
        pFVar8 = pFVar8->next;
      } while (pFVar8 != (Fl_Type *)0x0);
      if (bVar3) {
        set_modflag(1);
        return;
      }
    }
  }
  return;
}

Assistant:

void when_cb(Fl_Choice* i, void *v) {
  if (v == LOAD) {
    if (current_widget->is_menu_item()) {i->deactivate(); return;} else i->activate();
    int n = current_widget->o->when() & (~FL_WHEN_NOT_CHANGED);
    if (!n) n = ZERO_ENTRY;
    for (int j = 0; j < int(sizeof(whenmenu)/sizeof(*whenmenu)); j++)
      if (whenmenu[j].argument() == n) {i->value(j); break;}
  } else {
    int mod = 0;
    int m = i->value();
    int n = int(whenmenu[m].argument());
    if (!n) return; // should not happen
    if (n == ZERO_ENTRY) n = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	q->o->when(n|(q->o->when()&FL_WHEN_NOT_CHANGED));
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}